

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
__thiscall cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  char *in_RDX;
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  
  __s = "";
  if (in_RDX != (char *)0x0) {
    __s = in_RDX;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  Parse(this,(string *)input);
  std::__cxx11::string::~string(local_38);
  return (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmCompiledGeneratorExpression> cmGeneratorExpression::Parse(
  const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}